

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_bfba::ktxTexture_calcImageSize_ImageSizeAtEachLevelRGBA2D_Test::TestBody
          (ktxTexture_calcImageSize_ImageSizeAtEachLevelRGBA2D_Test *this)

{
  size_t sVar1;
  pointer *__ptr_4;
  pointer *__ptr;
  char *pcVar2;
  char *in_R9;
  uint *rhs;
  ulong uVar3;
  uint *rhs_00;
  int *piVar4;
  ktx_size_t imageSize;
  ktxTexture *texture;
  ktx_error_code_e result;
  ktx_uint32_t ktx2sizes [5];
  ktx_uint32_t ktx1sizes [5];
  AssertHelper local_e8;
  AssertHelper local_e0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  long local_a8;
  ktx_error_code_e local_9c;
  uint local_98 [8];
  uint local_78 [6];
  undefined8 local_60 [2];
  undefined8 local_50;
  undefined8 uStack_48;
  ulong local_40;
  undefined4 local_38;
  undefined2 local_34;
  
  local_a8 = 0;
  local_50 = 0x1000000010;
  uStack_48 = 0x200000001;
  local_60[0] = 0x2500008058;
  local_34 = 0;
  local_38 = 1;
  local_40 = 0x100000005;
  local_78[0] = 0x400;
  local_78[1] = 0x100;
  local_78[2] = 0x40;
  local_78[3] = 0x10;
  local_78[4] = 4;
  local_98[0] = 0x400;
  local_98[1] = 0x100;
  local_98[2] = 0x40;
  local_98[3] = 0x10;
  local_98[4] = 4;
  local_9c = ktxTexture1_Create(local_60,0);
  local_d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_d8._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_c8,"result","KTX_SUCCESS",&local_9c,(ktx_error_code_e *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x4dd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_d8._M_head_impl._0_1_ = local_a8 != 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a8 == 0) {
    testing::Message::Message((Message *)&local_e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_e8.data_)->line,"ktxTexture1_Create failed: ",0x1b);
    pcVar2 = (char *)ktxErrorString(local_9c);
    piVar4 = &(local_e8.data_)->line;
    if (pcVar2 == (char *)0x0) {
      sVar1 = 6;
      pcVar2 = "(null)";
    }
    else {
      sVar1 = strlen(pcVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar4,pcVar2,sVar1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)&local_d8,(AssertionResult *)0x17796e,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x4de,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
    }
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
    if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d0,local_d0);
    }
  }
  else {
    if ((int)local_40 != 0) {
      rhs_00 = local_78;
      rhs = local_98;
      uVar3 = 0;
      do {
        local_d8._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ktxTexture_calcImageSize(local_a8,uVar3 & 0xffffffff,1);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                  ((internal *)local_c8,"imageSize","ktx1sizes[i]",(unsigned_long *)&local_d8,rhs_00
                  );
        if (local_c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_e8);
          pcVar2 = "";
          if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar2 = (local_c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0x4e4,pcVar2);
          testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
          testing::internal::AssertHelper::~AssertHelper(&local_e0);
          if (local_e8.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_e8.data_ + 8))();
          }
        }
        if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c0,local_c0);
        }
        local_d8._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ktxTexture_calcImageSize(local_a8,uVar3 & 0xffffffff,2);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                  ((internal *)local_c8,"imageSize","ktx2sizes[i]",(unsigned_long *)&local_d8,rhs);
        if (local_c8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_e8);
          pcVar2 = "";
          if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar2 = (local_c0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0x4e7,pcVar2);
          testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
          testing::internal::AssertHelper::~AssertHelper(&local_e0);
          if (local_e8.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_e8.data_ + 8))();
          }
        }
        if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_c0,local_c0);
        }
        uVar3 = uVar3 + 1;
        rhs_00 = rhs_00 + 1;
        rhs = rhs + 1;
      } while (uVar3 < (local_40 & 0xffffffff));
      if (local_a8 == 0) {
        return;
      }
    }
    (*(code *)**(undefined8 **)(local_a8 + 8))();
  }
  return;
}

Assistant:

TEST(ktxTexture_calcImageSize, ImageSizeAtEachLevelRGBA2D) {
    ktxTexture* texture = 0;
    TestCreateInfo createInfo;
    KTX_error_code result;
    // Sizes for 16x16, 5 level RGBA8 texture.
    // level 0 ... level 4
    ktx_uint32_t ktx1sizes[] = {1024, 256, 64, 16, 4};
    ktx_uint32_t ktx2sizes[] = {1024, 256, 64, 16, 4};

    result = ktxTexture1_Create(&createInfo, KTX_TEXTURE_CREATE_NO_STORAGE,
                                (ktxTexture1**)&texture);
    EXPECT_EQ(result, KTX_SUCCESS);
    ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                 << ktxErrorString(result);
    for (ktx_uint32_t i = 0; i < createInfo.numLevels; i++) {
        ktx_size_t imageSize;
        imageSize = ktxTexture_calcImageSize(texture, i,
                                             KTX_FORMAT_VERSION_ONE);
        EXPECT_EQ(imageSize, ktx1sizes[i]);
        imageSize = ktxTexture_calcImageSize(texture, i,
                                             KTX_FORMAT_VERSION_TWO);
        EXPECT_EQ(imageSize, ktx2sizes[i]);
    }
    if (texture)
        ktxTexture_Destroy(texture);
}